

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_immediately_unittest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int v2;
  CheckOpString local_b8;
  LogMessage local_b0;
  string *local_50;
  _Check_string *_result;
  string local_38 [8];
  string early_stderr;
  char **argv_local;
  int argc_local;
  
  fLB::FLAGS_colorlogtostderr = 0;
  fLB::FLAGS_timestamp_in_logfile_name = 1;
  early_stderr.field_2._8_8_ = argv;
  argv_local._4_4_ = argc;
  setbuf(_stderr,(char *)0x0);
  google::CaptureTestStderr();
  google::GetCapturedTestStderr_abi_cxx11_();
  bVar1 = google::IsGoogleLoggingInitialized();
  if (bVar1) {
    fprintf(_stderr,"Check failed: %s\n","!(IsGoogleLoggingInitialized())");
    exit(1);
  }
  google::InitGoogleLogging(*(char **)early_stderr.field_2._8_8_);
  bVar1 = google::IsGoogleLoggingInitialized();
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","IsGoogleLoggingInitialized()");
    exit(1);
  }
  google::InitGoogleTest((int *)((long)&argv_local + 4),(char **)early_stderr.field_2._8_8_);
  iVar2 = google::RUN_ALL_TESTS();
  iVar2 = google::GetReferenceableValue(iVar2);
  v2 = google::GetReferenceableValue(0);
  local_50 = google::Check_EQImpl_abi_cxx11_(iVar2,v2,"RUN_ALL_TESTS() == 0");
  if (local_50 != (string *)0x0) {
    google::CheckOpString::CheckOpString(&local_b8,local_50);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/cleanup_immediately_unittest.cc"
               ,0x5f,&local_b8);
    google::LogMessage::stream(&local_b0);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_b0);
  }
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  FLAGS_colorlogtostderr = false;
  FLAGS_timestamp_in_logfile_name = true;
#ifdef GLOG_USE_GFLAGS
  ParseCommandLineFlags(&argc, &argv, true);
#endif
  // Make sure stderr is not buffered as stderr seems to be buffered
  // on recent windows.
  setbuf(stderr, nullptr);

  // Test some basics before InitGoogleLogging:
  CaptureTestStderr();
  const string early_stderr = GetCapturedTestStderr();

  EXPECT_FALSE(IsGoogleLoggingInitialized());

  InitGoogleLogging(argv[0]);

  EXPECT_TRUE(IsGoogleLoggingInitialized());

  InitGoogleTest(&argc, argv);
#ifdef HAVE_LIB_GMOCK
  InitGoogleMock(&argc, argv);
#endif

  // so that death tests run before we use threads
  CHECK_EQ(RUN_ALL_TESTS(), 0);
}